

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
AddCleared(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  
  pRVar3 = (this->super_RepeatedPtrFieldBase).rep_;
  if ((pRVar3 == (Rep *)0x0) ||
     (pRVar3->allocated_size == (this->super_RepeatedPtrFieldBase).total_size_)) {
    iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
    iVar2 = (this->super_RepeatedPtrFieldBase).total_size_;
    if (iVar1 <= iVar2) {
      internal::RepeatedPtrFieldBase::InternalExtend
                (&this->super_RepeatedPtrFieldBase,(iVar2 - iVar1) + 1);
    }
  }
  pRVar3 = (this->super_RepeatedPtrFieldBase).rep_;
  iVar1 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar1 + 1;
  pRVar3->elements[iVar1] = value;
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::AddCleared(Element* value) {
  return RepeatedPtrFieldBase::AddCleared<TypeHandler>(value);
}